

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

MainBuilder * __thiscall
kj::MainBuilder::expectArg
          (MainBuilder *this,StringPtr title,
          Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback)

{
  Impl *pIVar1;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t> local_28;
  undefined8 local_18;
  
  f.exception = (Exception *)title.content.ptr;
  pIVar1 = (this->impl).ptr;
  _kjCondition.value = (pIVar1->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  if (_kjCondition.value) {
    local_28.disposer = (callback->impl).disposer;
    local_28.ptr = (callback->impl).ptr;
    (callback->impl).ptr = (Iface *)0x0;
    local_18._0_4_ = 1;
    local_18._4_4_ = 1;
    Vector<kj::MainBuilder::Impl::Arg>::add<kj::MainBuilder::Impl::Arg>(&pIVar1->args,(Arg *)&f);
    Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose
              (&local_28);
    return this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[50]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
             ,0x161,FAILED,"impl->subCommands.empty()",
             "_kjCondition,\"cannot have sub-commands when expecting arguments\"",&_kjCondition,
             (char (*) [50])"cannot have sub-commands when expecting arguments");
  _::Debug::Fault::fatal(&f);
}

Assistant:

MainBuilder& MainBuilder::expectArg(StringPtr title, Function<Validity(StringPtr)> callback) {
  KJ_REQUIRE(impl->subCommands.empty(), "cannot have sub-commands when expecting arguments");
  impl->args.add(Impl::Arg { title, kj::mv(callback), 1, 1 });
  return *this;
}